

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_ext_key_share_parse_clienthello
               (SSL_HANDSHAKE *hs,bool *out_found,Span<const_unsigned_char> *out_peer_key,
               uint8_t *out_alert,SSL_CLIENT_HELLO *client_hello)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer psVar4;
  Span<const_unsigned_char> SVar5;
  uchar *local_98;
  size_t local_90;
  undefined1 local_88 [8];
  CBS peer_key_tmp;
  undefined1 auStack_70 [6];
  uint16_t id;
  CBS peer_key;
  undefined1 local_58 [6];
  uint16_t group_id;
  CBS key_shares;
  CBS contents;
  SSL_CLIENT_HELLO *client_hello_local;
  uint8_t *out_alert_local;
  Span<const_unsigned_char> *out_peer_key_local;
  bool *out_found_local;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = ssl_client_hello_get_extension(client_hello,(CBS *)&key_shares.len,0x33);
  if (bVar1) {
    iVar2 = CBS_get_u16_length_prefixed((CBS *)&key_shares.len,(CBS *)local_58);
    if ((iVar2 == 0) || (sVar3 = CBS_len((CBS *)&key_shares.len), sVar3 != 0)) {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x92f);
      hs_local._7_1_ = false;
    }
    else {
      psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         (&hs->new_session);
      peer_key.len._6_2_ = psVar4->group_id;
      CBS_init((CBS *)auStack_70,(uint8_t *)0x0,0);
      while (sVar3 = CBS_len((CBS *)local_58), sVar3 != 0) {
        iVar2 = CBS_get_u16((CBS *)local_58,(uint16_t *)((long)&peer_key_tmp.len + 6));
        if (((iVar2 == 0) ||
            (iVar2 = CBS_get_u16_length_prefixed((CBS *)local_58,(CBS *)local_88), iVar2 == 0)) ||
           (sVar3 = CBS_len((CBS *)local_88), sVar3 == 0)) {
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x93d);
          return false;
        }
        if (peer_key_tmp.len._6_2_ == peer_key.len._6_2_) {
          sVar3 = CBS_len((CBS *)auStack_70);
          if (sVar3 != 0) {
            ERR_put_error(0x10,0,0x108,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0x943);
            *out_alert = '/';
            return false;
          }
          _auStack_70 = (uint8_t *)local_88;
          peer_key.data = peer_key_tmp.data;
        }
      }
      if (out_peer_key != (Span<const_unsigned_char> *)0x0) {
        SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)auStack_70);
        local_98 = SVar5.data_;
        out_peer_key->data_ = local_98;
        local_90 = SVar5.size_;
        out_peer_key->size_ = local_90;
      }
      sVar3 = CBS_len((CBS *)auStack_70);
      *out_found = sVar3 != 0;
      hs_local._7_1_ = true;
    }
  }
  else {
    ERR_put_error(0x10,0,0x102,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x927);
    *out_alert = 'm';
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_ext_key_share_parse_clienthello(SSL_HANDSHAKE *hs, bool *out_found,
                                         Span<const uint8_t> *out_peer_key,
                                         uint8_t *out_alert,
                                         const SSL_CLIENT_HELLO *client_hello) {
  // We only support connections that include an ECDHE key exchange, or use a
  // PAKE.
  CBS contents;
  if (!ssl_client_hello_get_extension(client_hello, &contents,
                                      TLSEXT_TYPE_key_share)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_MISSING_KEY_SHARE);
    *out_alert = SSL_AD_MISSING_EXTENSION;
    return false;
  }

  CBS key_shares;
  if (!CBS_get_u16_length_prefixed(&contents, &key_shares) ||
      CBS_len(&contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  // Find the corresponding key share.
  const uint16_t group_id = hs->new_session->group_id;
  CBS peer_key;
  CBS_init(&peer_key, nullptr, 0);
  while (CBS_len(&key_shares) > 0) {
    uint16_t id;
    CBS peer_key_tmp;
    if (!CBS_get_u16(&key_shares, &id) ||
        !CBS_get_u16_length_prefixed(&key_shares, &peer_key_tmp) ||
        CBS_len(&peer_key_tmp) == 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }

    if (id == group_id) {
      if (CBS_len(&peer_key) != 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DUPLICATE_KEY_SHARE);
        *out_alert = SSL_AD_ILLEGAL_PARAMETER;
        return false;
      }

      peer_key = peer_key_tmp;
      // Continue parsing the structure to keep peers honest.
    }
  }

  if (out_peer_key != nullptr) {
    *out_peer_key = peer_key;
  }
  *out_found = CBS_len(&peer_key) != 0;
  return true;
}